

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::setData
          (GLAttributeBuffer *this,vector<float,_std::allocator<float>_> *data)

{
  vector<float,_std::allocator<float>_> *in_RDI;
  GLAttributeBuffer *unaff_retaddr;
  RenderDataType in_stack_000000ac;
  GLAttributeBuffer *in_stack_000000b0;
  
  checkType(in_stack_000000b0,in_stack_000000ac);
  setData_helper<float>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void GLAttributeBuffer::setData(const std::vector<float>& data) {
  checkType(RenderDataType::Float);
  setData_helper(data);
}